

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_segment.cpp
# Opt level: O1

void duckdb::ReadDataFromStructSegment
               (ListSegmentFunctions *functions,ListSegment *segment,Vector *result,
               idx_t *total_count)

{
  ulong *puVar1;
  ushort uVar2;
  idx_t iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ListSegment *pLVar4;
  read_data_from_segment_t p_Var5;
  byte bVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  const_reference pvVar10;
  reference this_01;
  type pVVar11;
  ulong uVar12;
  size_type __n;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  idx_t *local_40;
  idx_t local_38;
  
  FlatVector::VerifyFlatVector(result);
  if (segment->count != 0) {
    uVar12 = 0;
    do {
      if (*(char *)((long)&segment[1].count + uVar12) == '\x01') {
        iVar3 = *total_count;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_38 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var8 = p_Stack_50;
          peVar7 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar7;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var8;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar9->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar6 = (byte)(iVar3 + uVar12) & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (iVar3 + uVar12 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < segment->count);
  }
  this_00 = StructVector::GetEntries(result);
  if ((this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_00->
      super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar2 = segment->capacity;
    __n = 0;
    local_40 = total_count;
    do {
      pLVar4 = *(ListSegment **)((long)&segment[1].count + __n * 8 + (ulong)uVar2);
      pvVar10 = vector<duckdb::ListSegmentFunctions,_true>::operator[]
                          (&functions->child_functions,__n);
      p_Var5 = pvVar10->read_data;
      this_01 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::operator[](this_00,__n);
      pVVar11 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this_01);
      (*p_Var5)(pvVar10,pLVar4,pVVar11,local_40);
      __n = __n + 1;
    } while (__n < (ulong)((long)(this_00->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->
                                 super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

static void ReadDataFromStructSegment(const ListSegmentFunctions &functions, const ListSegment *segment, Vector &result,
                                      idx_t &total_count) {

	auto &aggr_vector_validity = FlatVector::Validity(result);

	// set NULLs
	auto null_mask = GetNullMask(segment);
	for (idx_t i = 0; i < segment->count; i++) {
		if (null_mask[i]) {
			aggr_vector_validity.SetInvalid(total_count + i);
		}
	}

	auto &children = StructVector::GetEntries(result);

	// recurse into the child segments of each child of the struct
	D_ASSERT(children.size() == functions.child_functions.size());
	auto struct_children = GetStructData(segment);
	for (idx_t child_count = 0; child_count < children.size(); child_count++) {
		auto struct_children_segment = Load<ListSegment *>(const_data_ptr_cast(struct_children + child_count));
		auto &child_function = functions.child_functions[child_count];
		child_function.read_data(child_function, struct_children_segment, *children[child_count], total_count);
	}
}